

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnp.cpp
# Opt level: O2

bool isPoseApproxEqual<RSSinglelinCameraPose>
               (RSSinglelinCameraPose *pose1,RSSinglelinCameraPose *pose2)

{
  double dVar1;
  RealScalar RVar2;
  RealScalar RVar3;
  RealScalar RVar4;
  RealScalar RVar5;
  double dVar6;
  RSSinglelinCameraPose *local_30;
  RSSinglelinCameraPose *local_28;
  
  local_30 = (RSSinglelinCameraPose *)&pose1->C;
  local_28 = (RSSinglelinCameraPose *)&pose2->C;
  RVar2 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_30);
  local_30 = pose1;
  local_28 = pose2;
  RVar3 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_30);
  local_30 = (RSSinglelinCameraPose *)&pose1->t;
  local_28 = (RSSinglelinCameraPose *)&pose2->t;
  RVar4 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_30);
  local_30 = (RSSinglelinCameraPose *)&pose1->w;
  local_28 = (RSSinglelinCameraPose *)&pose2->w;
  RVar5 = Eigen::
          MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::norm((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)&local_30);
  dVar1 = pose1->f;
  dVar6 = 1.0;
  if (1.0 <= dVar1) {
    dVar6 = dVar1;
  }
  return ABS(pose1->rd - pose2->rd) + ABS(dVar1 - pose2->f) / dVar6 + RVar5 + RVar4 + RVar3 + RVar2
         < 1e-06;
}

Assistant:

bool isPoseApproxEqual(T pose1, T pose2){
    double err = (pose1.C-pose2.C).norm();   
    err += (pose1.v-pose2.v).norm();
    err += (pose1.t-pose2.t).norm();
    err += (pose1.w-pose2.w).norm();
    err += std::abs(pose1.f-pose2.f)/std::max(pose1.f,1.0);
    err += std::abs(pose1.rd-pose2.rd);
    return err < 1e-6;
}